

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O2

RTCScene embree::addInstancedTriangleCube(RTCScene global_scene,Vec3fa *pos,uint num_time_steps)

{
  RTCScene pRVar1;
  undefined8 uVar2;
  uint t;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  AffineSpace3fa xfm;
  
  pRVar1 = (RTCScene)rtcNewScene(g_device);
  uVar2 = rtcNewGeometry(g_device,0);
  rtcSetSharedGeometryBuffer(uVar2,0,0,0x5003,data._136_8_,0,0xc,0xc);
  rtcSetSharedGeometryBuffer(uVar2,1,0,0x9003,data._128_8_,0,0x10);
  rtcCommitGeometry(uVar2);
  rtcAttachGeometry(pRVar1,uVar2);
  rtcReleaseGeometry(uVar2);
  rtcCommitScene(pRVar1);
  uVar2 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(uVar2,pRVar1);
  rtcSetGeometryTimeStepCount(uVar2,num_time_steps);
  for (uVar3 = 0; num_time_steps != uVar3; uVar3 = uVar3 + 1) {
    fVar11 = ((float)uVar3 * 6.2831855) / (float)(num_time_steps - 1);
    auVar9._0_12_ = ZEXT812(0x3f800000);
    auVar9._12_4_ = 0;
    auVar9 = rsqrtss(auVar9,auVar9);
    fVar4 = auVar9._0_4_;
    fVar6 = fVar4 * fVar4 * fVar4 * -0.5 + fVar4 * 1.5;
    fVar7 = fVar6 * 0.0;
    fVar10 = fVar6 * 1.0;
    fVar6 = fVar6 * 0.0;
    fVar4 = sinf(fVar11);
    fVar11 = cosf(fVar11);
    fVar5 = (1.0 - fVar7 * fVar7) * fVar11 + fVar7 * fVar7;
    fVar12 = 1.0 - fVar11;
    fVar17 = fVar7 * fVar10 * fVar12;
    fVar8 = fVar17 - fVar4 * fVar6;
    fVar17 = fVar4 * fVar6 + fVar17;
    fVar18 = (1.0 - fVar10 * fVar10) * fVar11 + fVar10 * fVar10;
    fVar30 = fVar7 * fVar6 * fVar12;
    fVar12 = fVar10 * fVar6 * fVar12;
    fVar13 = fVar30 + fVar4 * fVar10;
    fVar30 = fVar30 - fVar4 * fVar10;
    fVar29 = fVar12 - fVar7 * fVar4;
    fVar12 = fVar7 * fVar4 + fVar12;
    fVar31 = (1.0 - fVar6 * fVar6) * fVar11 + fVar6 * fVar6;
    fVar4 = fVar5 * 1.0 + fVar17 * 0.0 + fVar30 * 0.0;
    fVar11 = fVar5 * 0.0 + fVar17 * 1.0 + fVar30 * 0.0;
    fVar6 = fVar5 * 0.0 + fVar17 * 0.0 + fVar30 * 1.0;
    fVar5 = fVar8 * 1.0 + fVar18 * 0.0 + fVar12 * 0.0;
    fVar7 = fVar8 * 0.0 + fVar18 * 1.0 + fVar12 * 0.0;
    fVar8 = fVar8 * 0.0 + fVar18 * 0.0 + fVar12 * 1.0;
    fVar10 = fVar13 * 1.0 + fVar29 * 0.0 + fVar31 * 0.0;
    fVar12 = fVar13 * 0.0 + fVar29 * 1.0 + fVar31 * 0.0;
    fVar13 = fVar13 * 0.0 + fVar29 * 0.0 + fVar31 * 1.0;
    fVar17 = fVar10 * 0.0 + fVar5 + fVar4 * 0.0;
    fVar21 = fVar12 * 0.0 + fVar7 + fVar11 * 0.0;
    fVar24 = fVar13 * 0.0 + fVar8 + fVar6 * 0.0;
    fVar18 = fVar4 * 0.0 + fVar10 + fVar5 * 0.0;
    fVar14 = fVar11 * 0.0 + fVar12 + fVar7 * 0.0;
    fVar15 = fVar6 * 0.0 + fVar13 + fVar8 * 0.0;
    fVar29 = fVar5 * 0.0 + fVar10 * 0.0 + fVar4;
    fVar30 = fVar7 * 0.0 + fVar12 * 0.0 + fVar11;
    fVar31 = fVar8 * 0.0 + fVar13 * 0.0 + fVar6;
    fVar4 = fVar4 * -0.0 + fVar5 * -0.0 + fVar10 * -0.0 + 0.0;
    fVar5 = fVar11 * -0.0 + fVar7 * -0.0 + fVar12 * -0.0 + 0.0;
    fVar7 = fVar6 * -0.0 + fVar8 * -0.0 + fVar13 * -0.0 + 0.0;
    fVar11 = fVar29 * 1.0 + fVar30 * 0.0 + fVar31 * 0.0;
    fVar6 = fVar29 * 0.0 + fVar30 * 1.0 + fVar31 * 0.0;
    fVar8 = fVar29 * 0.0 + fVar30 * 0.0 + fVar31 * 1.0;
    fVar10 = fVar29 * 0.0 + fVar30 * 0.0 + fVar31 * 0.0;
    fVar29 = fVar17 * 1.0 + fVar21 * 0.0 + fVar24 * 0.0;
    fVar30 = fVar17 * 0.0 + fVar21 * 1.0 + fVar24 * 0.0;
    fVar31 = fVar17 * 0.0 + fVar21 * 0.0 + fVar24 * 1.0;
    fVar21 = fVar17 * 0.0 + fVar21 * 0.0 + fVar24 * 0.0;
    fVar12 = fVar18 * 1.0 + fVar14 * 0.0 + fVar15 * 0.0;
    fVar13 = fVar18 * 0.0 + fVar14 * 1.0 + fVar15 * 0.0;
    fVar17 = fVar18 * 0.0 + fVar14 * 0.0 + fVar15 * 1.0;
    fVar18 = fVar18 * 0.0 + fVar14 * 0.0 + fVar15 * 0.0;
    fVar14 = fVar12 * 0.0;
    fVar15 = fVar13 * 0.0;
    fVar24 = fVar17 * 0.0;
    fVar16 = fVar18 * 0.0;
    fVar19 = fVar29 * 0.0;
    fVar22 = fVar30 * 0.0;
    fVar25 = fVar31 * 0.0;
    fVar27 = fVar21 * 0.0;
    fVar20 = fVar19 + fVar14;
    fVar23 = fVar22 + fVar15;
    fVar26 = fVar25 + fVar24;
    fVar28 = fVar27 + fVar16;
    xfm.l.vx.field_0.m128[0] = fVar11 + fVar11 + fVar20;
    xfm.l.vx.field_0.m128[1] = fVar6 + fVar6 + fVar23;
    xfm.l.vx.field_0.m128[2] = fVar8 + fVar8 + fVar26;
    xfm.l.vx.field_0.m128[3] = fVar10 + fVar10 + fVar28;
    fVar11 = fVar11 * 0.0;
    fVar6 = fVar6 * 0.0;
    fVar8 = fVar8 * 0.0;
    fVar10 = fVar10 * 0.0;
    xfm.l.vy.field_0.m128[0] = fVar14 + fVar29 + fVar11;
    xfm.l.vy.field_0.m128[1] = fVar15 + fVar30 + fVar6;
    xfm.l.vy.field_0.m128[2] = fVar24 + fVar31 + fVar8;
    xfm.l.vy.field_0.m128[3] = fVar16 + fVar21 + fVar10;
    xfm.l.vz.field_0.m128[0] = fVar12 + fVar19 + fVar11;
    xfm.l.vz.field_0.m128[1] = fVar13 + fVar22 + fVar6;
    xfm.l.vz.field_0.m128[2] = fVar17 + fVar25 + fVar8;
    xfm.l.vz.field_0.m128[3] = fVar18 + fVar27 + fVar10;
    xfm.p.field_0.m128[0] =
         fVar11 + fVar20 + fVar4 * 1.0 + fVar5 * 0.0 + fVar7 * 0.0 + (pos->field_0).m128[0];
    xfm.p.field_0.m128[1] =
         fVar6 + fVar23 + fVar4 * 0.0 + fVar5 * 1.0 + fVar7 * 0.0 + (pos->field_0).m128[1];
    xfm.p.field_0.m128[2] =
         fVar8 + fVar26 + fVar4 * 0.0 + fVar5 * 0.0 + fVar7 * 1.0 + (pos->field_0).m128[2];
    xfm.p.field_0.m128[3] =
         fVar10 + fVar28 + fVar4 * 0.0 + fVar5 * 0.0 + fVar7 * 0.0 + (pos->field_0).m128[3];
    rtcSetGeometryTransform(uVar2,uVar3,0x9244,&xfm);
  }
  rtcCommitGeometry(uVar2);
  rtcAttachGeometry(global_scene,uVar2);
  rtcReleaseGeometry(uVar2);
  return pRVar1;
}

Assistant:

RTCScene addInstancedTriangleCube (RTCScene global_scene, const Vec3fa& pos, unsigned int num_time_steps)
{
  RTCScene scene = rtcNewScene(g_device);
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX,  0, RTC_FORMAT_UINT3,  data.cube_triangle_indices, 0, 3*sizeof(unsigned int), 12);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, data.cube_vertices, 0, 4*sizeof(float), 8);
  rtcCommitGeometry(geom);
  rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  rtcCommitScene(scene);

  RTCGeometry inst = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
   rtcSetGeometryInstancedScene(inst,scene);
   rtcSetGeometryTimeStepCount(inst,num_time_steps);
  
  for (unsigned int t=0; t<num_time_steps; t++)
  {
    AffineSpace3fa rotation = AffineSpace3fa::rotate(Vec3fa(0,0,0),Vec3fa(0,1,0),2.0f*float(M_PI)*(float)t/(float)(num_time_steps-1));
    AffineSpace3fa scale = AffineSpace3fa::scale(Vec3fa(2.0f,1.0f,1.0f));
    AffineSpace3fa translation = AffineSpace3fa::translate(pos);
    AffineSpace3fa xfm = translation*rotation*scale;
    rtcSetGeometryTransform(inst,t,RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR,(float*)&xfm);
  }

  rtcCommitGeometry(inst);
  rtcAttachGeometry(global_scene,inst);
  rtcReleaseGeometry(inst);
  return scene;
}